

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

QString * __thiscall
DebugDirCVEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this,size_t fId)

{
  char *ch;
  
  if (fId < 4) {
    ch = &DAT_00135b98 + *(int *)(&DAT_00135b98 + fId * 4);
  }
  else {
    ch = "";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getFieldName(size_t fId)
{
    switch (fId) {
        case F_CVDBG_SIGN: return "CvSig";
        case F_CVDBG_GUID: return "Signature";
        case F_CVDBG_AGE: return "Age";
        case F_CVDBG_PDB: return "PDB";
    }
    return "";
}